

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void av1_fwd_txfm2d_64x32_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int8_t *piVar1;
  int in_EDX;
  __m128i *in_RSI;
  long in_RDI;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int num_col;
  int num_row;
  int bitrow;
  int bitcol;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i *outcoef128;
  __m128i in [512];
  int in_stack_000020e4;
  int in_stack_000020e8;
  int8_t in_stack_000020ef;
  __m128i *in_stack_000020f0;
  __m128i *in_stack_000020f8;
  int local_2068;
  int shift_00;
  int iVar2;
  int iVar3;
  longlong local_2028 [6];
  int in_stack_ffffffffffffe00c;
  int in_stack_ffffffffffffe010;
  int in_stack_ffffffffffffe014;
  __m128i *in_stack_ffffffffffffe018;
  __m128i *in_stack_ffffffffffffe020;
  longlong alStack_1fa8 [8];
  longlong alStack_1f68 [494];
  int in_stack_fffffffffffff008;
  int in_stack_fffffffffffff00c;
  __m128i *in_stack_fffffffffffff010;
  __m128i *in_stack_fffffffffffff018;
  
  piVar1 = av1_fwd_txfm_shift_ls[0xc];
  get_txw_idx('\f');
  get_txh_idx('\f');
  for (iVar3 = 0; iVar3 < 0x20; iVar3 = iVar3 + 1) {
    load_buffer_4x4((int16_t *)(in_RDI + (long)(iVar3 * in_EDX) * 2),
                    (__m128i *)(local_2028 + (long)(iVar3 << 4) * 2),4,0,0,(int)*piVar1);
    load_buffer_4x4((int16_t *)(in_RDI + 0x20 + (long)(iVar3 * in_EDX) * 2),
                    (__m128i *)(&stack0xffffffffffffe018 + (long)(iVar3 << 4) * 0x10),4,0,0,
                    (int)*piVar1);
    load_buffer_4x4((int16_t *)(in_RDI + 0x40 + (long)(iVar3 * in_EDX) * 2),
                    (__m128i *)(alStack_1fa8 + (long)(iVar3 << 4) * 2),4,0,0,(int)*piVar1);
    load_buffer_4x4((int16_t *)(in_RDI + 0x60 + (long)(iVar3 * in_EDX) * 2),
                    (__m128i *)(alStack_1f68 + (long)(iVar3 << 4) * 2),4,0,0,(int)*piVar1);
  }
  for (iVar2 = 0; iVar2 < 0x10; iVar2 = iVar2 + 1) {
    av1_fdct32_sse4_1(in_stack_fffffffffffff018,in_stack_fffffffffffff010,in_stack_fffffffffffff00c,
                      in_stack_fffffffffffff008);
  }
  for (shift_00 = 0; shift_00 < 8; shift_00 = shift_00 + 1) {
    col_txfm_16x16_rounding((__m128i *)CONCAT44(iVar3,iVar2),shift_00);
  }
  transpose_8nx8n((__m128i *)local_2028,in_RSI,0x40,0x20);
  for (local_2068 = 0; local_2068 < 8; local_2068 = local_2068 + 1) {
    av1_fdct64_sse4_1(in_stack_000020f8,in_stack_000020f0,in_stack_000020ef,in_stack_000020e8,
                      in_stack_000020e4);
  }
  av1_round_shift_rect_array_32_sse4_1
            (in_stack_ffffffffffffe020,in_stack_ffffffffffffe018,in_stack_ffffffffffffe014,
             in_stack_ffffffffffffe010,in_stack_ffffffffffffe00c);
  return;
}

Assistant:

void av1_fwd_txfm2d_64x32_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  (void)tx_type;
  __m128i in[512];
  __m128i *outcoef128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_64X32];
  const int txw_idx = get_txw_idx(TX_64X32);
  const int txh_idx = get_txh_idx(TX_64X32);
  const int txfm_size_col = tx_size_wide[TX_64X32];
  const int txfm_size_row = tx_size_high[TX_64X32];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int num_row = txfm_size_row >> 2;
  const int num_col = txfm_size_col >> 2;

  // column transform
  for (int i = 0; i < 32; i++) {
    load_buffer_4x4(input + 0 + i * stride, in + 0 + i * 16, 4, 0, 0, shift[0]);
    load_buffer_4x4(input + 16 + i * stride, in + 4 + i * 16, 4, 0, 0,
                    shift[0]);
    load_buffer_4x4(input + 32 + i * stride, in + 8 + i * 16, 4, 0, 0,
                    shift[0]);
    load_buffer_4x4(input + 48 + i * stride, in + 12 + i * 16, 4, 0, 0,
                    shift[0]);
  }

  for (int i = 0; i < num_col; i++) {
    av1_fdct32_sse4_1((in + i), (in + i), bitcol, num_col);
  }

  for (int i = 0; i < num_row; i++) {
    col_txfm_16x16_rounding((in + i * txfm_size_col), -shift[1]);
  }
  transpose_8nx8n(in, outcoef128, txfm_size_col, txfm_size_row);

  // row transform
  for (int i = 0; i < num_row; i++) {
    av1_fdct64_sse4_1((outcoef128 + i), (in + i), bitrow, num_row, num_row);
  }
  av1_round_shift_rect_array_32_sse4_1(in, outcoef128, 512, -shift[2],
                                       NewSqrt2);
  (void)bd;
}